

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O2

Token __thiscall
slang::parsing::NumberParser::finishValue(NumberParser *this,Token firstToken,bool singleToken)

{
  SmallVector<slang::logic_t,_40UL> *this_00;
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  SourceLocation location;
  BumpAllocator *pBVar4;
  uint32_t uVar5;
  int iVar6;
  undefined4 extraout_var;
  reference plVar7;
  undefined4 extraout_var_00;
  Diagnostic *this_01;
  undefined4 extraout_var_01;
  logic_error *this_02;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  undefined8 uVar8;
  size_type in_R9;
  bitwidth_t bVar9;
  LiteralBase base;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar10;
  Token TVar11;
  span<const_slang::logic_t,_18446744073709551615UL> digits;
  allocator<char> local_111;
  SVInt result;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_f0;
  Info *local_e8;
  Token firstToken_local;
  string_view local_c0;
  pointer local_a0;
  size_type sStack_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  firstToken_local.info = firstToken.info;
  firstToken_local._0_8_ = firstToken._0_8_;
  if (this->valid == false) {
    pBVar4 = this->alloc;
    sVar10 = Token::trivia(&firstToken_local);
    if (singleToken) {
      local_c0 = Token::rawText(&firstToken_local);
    }
    else {
      iVar6 = SmallVectorBase<char>::copy
                        (&(this->text).super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,
                         (EVP_PKEY_CTX *)sVar10.size_);
      local_c0._M_str._4_4_ = extraout_var;
      local_c0._M_str._0_4_ = iVar6;
      local_c0._M_len = extraout_RDX;
    }
    location = this->firstLocation;
    SVInt::SVInt<int,void>(&result,0);
    Token::Token((Token *)&local_f0,pBVar4,IntegerLiteral,sVar10,local_c0,location,&result);
    SVInt::~SVInt(&result);
    uVar8 = CONCAT71(local_f0.val._1_7_,local_f0.val._0_1_);
    goto LAB_002a46ee;
  }
  if ((this->literalBase == Decimal) && (this->hasUnknown == false)) {
    uVar1 = (this->decimalValue).super_SVIntStorage.bitWidth;
    result.super_SVIntStorage.field_0.val = 0;
    result.super_SVIntStorage.bitWidth = 1;
    result.super_SVIntStorage.signFlag = false;
    result.super_SVIntStorage.unknownFlag = false;
    uVar2 = this->sizeBits;
    bVar9 = (bitwidth_t)&this->decimalValue;
    if (uVar2 == 0) {
      if (uVar1 < 0x20) {
        SVInt::resize((SVInt *)&local_f0,bVar9);
        goto LAB_002a453d;
      }
LAB_002a4559:
      SVInt::operator=(&result,&this->decimalValue);
    }
    else {
      if (uVar1 == uVar2) goto LAB_002a4559;
      if (uVar2 < uVar1) {
        addDiag(this,(DiagCode)0xb0003,this->firstLocation);
      }
      SVInt::resize((SVInt *)&local_f0,bVar9);
LAB_002a453d:
      SVInt::operator=(&result,(SVInt *)&local_f0);
      SVInt::~SVInt((SVInt *)&local_f0);
    }
    result.super_SVIntStorage.signFlag = this->signFlag;
    pBVar4 = this->alloc;
    sVar10 = Token::trivia(&firstToken_local);
    if (singleToken) {
      local_c0 = Token::rawText(&firstToken_local);
    }
    else {
      iVar6 = SmallVectorBase<char>::copy
                        (&(this->text).super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,
                         (EVP_PKEY_CTX *)sVar10.size_);
      local_c0._M_str._4_4_ = extraout_var_00;
      local_c0._M_str._0_4_ = iVar6;
      local_c0._M_len = extraout_RDX_00;
    }
    Token::Token((Token *)&local_f0,pBVar4,IntegerLiteral,sVar10,local_c0,this->firstLocation,
                 &result);
  }
  else {
    this_00 = &this->digits;
    sVar3 = (this->digits).super_SmallVectorBase<slang::logic_t>.len;
    if (sVar3 == 0) {
      local_f0.val._0_1_ = 0;
      SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t>
                (&this_00->super_SmallVectorBase<slang::logic_t>,(logic_t *)&local_f0);
    }
    else {
      switch(this->literalBase) {
      case Binary:
        iVar6 = 1;
        break;
      case Octal:
        iVar6 = 3;
        break;
      case Decimal:
        goto switchD_002a43a7_caseD_2;
      case Hex:
        iVar6 = 4;
        break;
      default:
        this_02 = (logic_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/NumberParser.cpp"
                   ,&local_111);
        std::operator+(&local_50,&local_70,":");
        std::__cxx11::to_string(&local_90,0xe5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       &local_50,&local_90);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       ": ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_c0,"Default case should be unreachable!");
        std::logic_error::logic_error(this_02,(string *)&local_f0);
        __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      bVar9 = ((int)sVar3 + -1) * iVar6;
      plVar7 = SmallVectorBase<slang::logic_t>::operator[]
                         (&this_00->super_SmallVectorBase<slang::logic_t>,0);
      if ((plVar7->value != 0x80) && (plVar7->value != '@')) {
        plVar7 = SmallVectorBase<slang::logic_t>::operator[]
                           (&this_00->super_SmallVectorBase<slang::logic_t>,0);
        uVar5 = clog2((ulong)plVar7->value + 1);
        bVar9 = uVar5 + bVar9;
      }
      if (this->sizeBits < bVar9) {
        if (this->sizeBits == 0) {
          if (bVar9 < 0x1000000) {
            if (bVar9 < 0x21) {
              bVar9 = 0x20;
            }
          }
          else {
            this_01 = addDiag(this,(DiagCode)0x20003,this->firstLocation);
            bVar9 = 0xffffff;
            Diagnostic::operator<<(this_01,0xffffff);
          }
          this->sizeBits = bVar9;
        }
        else {
          addDiag(this,(DiagCode)0xb0003,this->firstLocation);
        }
      }
    }
switchD_002a43a7_caseD_2:
    base = 0x20;
    if (this->sizeBits != 0) {
      base = (LiteralBase)this->sizeBits;
    }
    digits.data_ = (pointer)(ulong)this->hasUnknown;
    local_a0 = (this->digits).super_SmallVectorBase<slang::logic_t>.data_;
    sStack_98 = (this->digits).super_SmallVectorBase<slang::logic_t>.len;
    digits.size_ = in_R9;
    SVInt::fromDigits((bitwidth_t)&result,base,(bool)this->literalBase,this->signFlag,digits);
    pBVar4 = this->alloc;
    sVar10 = Token::trivia(&firstToken_local);
    if (singleToken) {
      local_c0 = Token::rawText(&firstToken_local);
    }
    else {
      iVar6 = SmallVectorBase<char>::copy
                        (&(this->text).super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,
                         (EVP_PKEY_CTX *)sVar10.size_);
      local_c0._M_str._4_4_ = extraout_var_01;
      local_c0._M_str._0_4_ = iVar6;
      local_c0._M_len = extraout_RDX_01;
    }
    Token::Token((Token *)&local_f0,pBVar4,IntegerLiteral,sVar10,local_c0,this->firstLocation,
                 &result);
  }
  uVar8 = CONCAT71(local_f0.val._1_7_,local_f0.val._0_1_);
  SVInt::~SVInt(&result);
LAB_002a46ee:
  TVar11.info = local_e8;
  TVar11.kind = (short)uVar8;
  TVar11._2_1_ = (char)((ulong)uVar8 >> 0x10);
  TVar11.numFlags.raw = (char)((ulong)uVar8 >> 0x18);
  TVar11.rawLen = (int)((ulong)uVar8 >> 0x20);
  return TVar11;
}

Assistant:

Token NumberParser::finishValue(Token firstToken, bool singleToken) {
    auto createResult = [&](auto&& val) {
        return Token(alloc, TokenKind::IntegerLiteral, firstToken.trivia(),
                     singleToken ? firstToken.rawText() : toStringView(text.copy(alloc)),
                     firstLocation, std::forward<decltype(val)>(val));
    };

    if (!valid)
        return createResult(0);

    if (literalBase == LiteralBase::Decimal) {
        // If we added an x or z, fall through to the general handler below.
        // Otherwise, optimize for this case by reusing the integer value already
        // computed by the token itself.
        if (!hasUnknown) {
            // If no size was specified, just return the value as-is. Otherwise,
            // resize it to match the desired size. Warn if that will truncate.
            bitwidth_t width = decimalValue.getBitWidth();
            SVInt result;
            if (!sizeBits) {
                // Unsized numbers are required to be at least 32 bits by the spec.
                if (width < 32)
                    result = decimalValue.resize(32);
                else
                    result = std::move(decimalValue);
            }
            else if (width != sizeBits) {
                if (width > sizeBits)
                    addDiag(diag::VectorLiteralOverflow, firstLocation);

                result = decimalValue.resize(sizeBits);
            }
            else {
                result = std::move(decimalValue);
            }

            result.setSigned(signFlag);
            return createResult(result);
        }
    }

    if (digits.empty()) {
        digits.push_back(logic_t(0));
    }
    else if (literalBase != LiteralBase::Decimal) {
        uint32_t multiplier = 0;
        switch (literalBase) {
            case LiteralBase::Binary:
                multiplier = 1;
                break;
            case LiteralBase::Octal:
                multiplier = 3;
                break;
            case LiteralBase::Hex:
                multiplier = 4;
                break;
            default:
                ASSUME_UNREACHABLE;
        }

        // All of the digits in the number require `multiplier` bits, except for
        // possibly the first (leading) digit. This one has leading zeros in it,
        // so only requires clog2(d+1) bits.
        bitwidth_t bits = 0;
        if (digits.size() > 1)
            bits = bitwidth_t(digits.size() - 1) * multiplier;

        // If the leading digit is unknown however, allow any size.
        if (!digits[0].isUnknown())
            bits += clog2(digits[0].value + 1);

        if (bits > sizeBits) {
            if (sizeBits == 0) {
                if (bits > SVInt::MAX_BITS) {
                    bits = SVInt::MAX_BITS;
                    addDiag(diag::LiteralSizeTooLarge, firstLocation) << (int)SVInt::MAX_BITS;
                }

                sizeBits = std::max(32u, bits);
            }
            else {
                // We should warn about overflow here, but the spec says it is valid and
                // the literal gets truncated. Definitely a warning though.
                addDiag(diag::VectorLiteralOverflow, firstLocation);
            }
        }
    }

    return createResult(
        SVInt::fromDigits(sizeBits ? sizeBits : 32, literalBase, signFlag, hasUnknown, digits));
}